

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# charmap.cpp
# Opt level: O0

void __thiscall CCharmapToLocal8859_1::CCharmapToLocal8859_1(CCharmapToLocal8859_1 *this)

{
  undefined1 *puVar1;
  void *pvVar2;
  undefined8 *in_RDI;
  wchar_t c;
  size_t siz;
  uchar *dst;
  CCharmapToLocalSB *in_stack_ffffffffffffffd0;
  uint in_stack_ffffffffffffffd8;
  wchar_t in_stack_ffffffffffffffdc;
  undefined4 in_stack_ffffffffffffffe0;
  undefined4 in_stack_ffffffffffffffe4;
  int iVar3;
  undefined1 *local_10;
  
  CCharmapToLocalSB::CCharmapToLocalSB(in_stack_ffffffffffffffd0);
  *in_RDI = &PTR__CCharmapToLocal8859_1_0042c518;
  pvVar2 = malloc(0x202);
  in_RDI[0x202] = pvVar2;
  puVar1 = (undefined1 *)in_RDI[0x202];
  CCharmapToLocal::set_mapping
            ((CCharmapToLocal *)CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0),
             in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8);
  *puVar1 = 1;
  puVar1[1] = 0x3f;
  for (iVar3 = 0; local_10 = puVar1 + 2, iVar3 < 0x100; iVar3 = iVar3 + 1) {
    CCharmapToLocal::set_mapping
              ((CCharmapToLocal *)CONCAT44(iVar3,in_stack_ffffffffffffffe0),
               in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8);
    *local_10 = 1;
    puVar1[3] = (char)iVar3;
    puVar1 = local_10;
  }
  return;
}

Assistant:

CCharmapToLocal8859_1::CCharmapToLocal8859_1()
{
    unsigned char *dst;
    size_t siz;
    wchar_t c;

    /* 
     *   Determine how much space we'll need in the translation array - we
     *   need one byte for each character, plus one byte for the length of
     *   each character.  We also need two bytes for the default entry.  
     */
    siz = 256 + 256 + 2;

    /* allocate the mapping */
    xlat_array_ = (unsigned char *)t3malloc(siz);

    /* start at the start of the array */
    dst = xlat_array_;

    /* 
     *   Add the zeroeth entry, which serves as the default mapping for
     *   characters that aren't otherwise mappable.  
     */
    set_mapping(0, 0);
    *dst++ = 1;
    *dst++ = '?';

    /* 
     *   Set up the mappings - this is easy because each Unicode code point
     *   from 0 to 255 maps to the same ISO 8859-1 code point.  
     */
    for (c = 0 ; c < 256 ; ++c)
    {
        /* set the mapping's offset in the translation array */
        set_mapping(c, dst - xlat_array_);

        /* store the length (always 1) and translated character */
        *dst++ = 1;
        *dst++ = (unsigned char)c;
    }
}